

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O3

optional<uint256> * __thiscall
BlockFilterIndex::ReadFilterHeader
          (optional<uint256> *__return_storage_ptr__,BlockFilterIndex *this,int height,
          uint256 *expected_block_hash)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  string_view logging_function;
  string_view source_file;
  string local_d8;
  string local_b8;
  pair<uint256,_(anonymous_namespace)::DBVal> read_out;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  read_out.second.pos.nFile = -1;
  read_out.second.pos.nPos = 0;
  local_b8._M_dataplus._M_p._0_4_ = height;
  bVar2 = CDBWrapper::
          Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                    (&((this->m_db)._M_t.
                       super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                       super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper
                     ,(DBHeightKey *)&local_b8,&read_out);
  if (bVar2) {
    auVar4[0] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x10] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar4[1] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x11] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar4[2] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x12] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar4[3] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x13] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar4[4] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x14] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar4[5] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x15] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar4[6] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x16] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar4[7] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x17] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar4[8] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x18] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar4[9] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x19] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar4[10] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1a] ==
                  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar4[0xb] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1b] ==
                   read_out.first.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar4[0xc] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1c] ==
                   read_out.first.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar4[0xd] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1d] ==
                   read_out.first.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar4[0xe] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1e] ==
                   read_out.first.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar4[0xf] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0x1f] ==
                   read_out.first.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar3[0] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[0]);
    auVar3[1] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[1] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[1]);
    auVar3[2] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[2] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[2]);
    auVar3[3] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[3] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[3]);
    auVar3[4] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[4] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[4]);
    auVar3[5] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[5] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[5]);
    auVar3[6] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[6] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[6]);
    auVar3[7] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[7] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[7]);
    auVar3[8] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[8] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[8]);
    auVar3[9] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[9] ==
                 read_out.first.super_base_blob<256U>.m_data._M_elems[9]);
    auVar3[10] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[10] ==
                  read_out.first.super_base_blob<256U>.m_data._M_elems[10]);
    auVar3[0xb] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0xb] ==
                   read_out.first.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar3[0xc] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0xc] ==
                   read_out.first.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar3[0xd] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0xd] ==
                   read_out.first.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar3[0xe] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0xe] ==
                   read_out.first.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar3[0xf] = -((expected_block_hash->super_base_blob<256U>).m_data._M_elems[0xf] ==
                   read_out.first.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar3 = auVar3 & auVar4;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x10) =
           read_out.second.header.super_base_blob<256U>.m_data._M_elems._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x18) =
           read_out.second.header.super_base_blob<256U>.m_data._M_elems._24_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
        super__Optional_payload_base<uint256>._M_payload =
           read_out.second.header.super_base_blob<256U>.m_data._M_elems._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 8) =
           read_out.second.header.super_base_blob<256U>.m_data._M_elems._8_8_;
      bVar2 = true;
      goto LAB_00472579;
    }
    base_blob<256u>::ToString_abi_cxx11_(&local_b8,&read_out);
    base_blob<256u>::ToString_abi_cxx11_(&local_d8,expected_block_hash);
    logging_function._M_str = "ReadFilterHeader";
    logging_function._M_len = 0x10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
    ;
    source_file._M_len = 0x6a;
    LogPrintFormatInternal<char[17],std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0xf4,ALL,Error,(ConstevalFormatString<3U>)0x818bcb,
               (char (*) [17])"ReadFilterHeader",&local_b8,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,(int)local_b8._M_dataplus._M_p) !=
        &local_b8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_b8._M_dataplus._M_p._4_4_,(int)local_b8._M_dataplus._M_p),
                      local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = false;
LAB_00472579:
  (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> BlockFilterIndex::ReadFilterHeader(int height, const uint256& expected_block_hash)
{
    std::pair<uint256, DBVal> read_out;
    if (!m_db->Read(DBHeightKey(height), read_out)) {
        return std::nullopt;
    }

    if (read_out.first != expected_block_hash) {
        LogError("%s: previous block header belongs to unexpected block %s; expected %s\n",
                         __func__, read_out.first.ToString(), expected_block_hash.ToString());
        return std::nullopt;
    }

    return read_out.second.header;
}